

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_huffman_codes(stbi__zbuf *a)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte local_a09;
  int local_a08;
  stbi_uc fill;
  int c;
  int s;
  int ntot;
  int hclen;
  int hdist;
  int hlit;
  int n;
  int i;
  stbi_uc codelength_sizes [19];
  byte local_9c8 [8];
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  stbi__zbuf *a_local;
  
  uVar1 = stbi__zreceive(a,5);
  iVar2 = uVar1 + 0x101;
  uVar1 = stbi__zreceive(a,5);
  uVar3 = stbi__zreceive(a,4);
  iVar4 = iVar2 + uVar1 + 1;
  memset(&n,0,0x13);
  for (hlit = 0; hlit < (int)(uVar3 + 4); hlit = hlit + 1) {
    uVar5 = stbi__zreceive(a,3);
    *(char *)((long)&n + (ulong)"\x10\x11\x12"[hlit]) = (char)uVar5;
  }
  iVar6 = stbi__zbuild_huffman((stbi__zhuffman *)(lencodes + 0x1c4),(stbi_uc *)&n,0x13);
  if (iVar6 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    hdist = 0;
    while (hdist < iVar4) {
      iVar6 = stbi__zhuffman_decode(a,(stbi__zhuffman *)(lencodes + 0x1c4));
      if ((iVar6 < 0) || (0x12 < iVar6)) {
        iVar2 = stbi__err("Corrupt PNG");
        return iVar2;
      }
      if (iVar6 < 0x10) {
        local_9c8[hdist] = (byte)iVar6;
        hdist = hdist + 1;
      }
      else {
        local_a09 = 0;
        if (iVar6 == 0x10) {
          uVar3 = stbi__zreceive(a,2);
          local_a08 = uVar3 + 3;
          if (hdist == 0) {
            iVar2 = stbi__err("Corrupt PNG");
            return iVar2;
          }
          local_a09 = local_9c8[hdist + -1];
        }
        else if (iVar6 == 0x11) {
          uVar3 = stbi__zreceive(a,3);
          local_a08 = uVar3 + 3;
        }
        else {
          if (iVar6 != 0x12) {
            iVar2 = stbi__err("Corrupt PNG");
            return iVar2;
          }
          uVar3 = stbi__zreceive(a,7);
          local_a08 = uVar3 + 0xb;
        }
        if (iVar4 - hdist < local_a08) {
          iVar2 = stbi__err("Corrupt PNG");
          return iVar2;
        }
        memset(local_9c8 + hdist,(uint)local_a09,(long)local_a08);
        hdist = local_a08 + hdist;
      }
    }
    if (hdist == iVar4) {
      iVar4 = stbi__zbuild_huffman(&a->z_length,local_9c8,iVar2);
      if (iVar4 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        iVar2 = stbi__zbuild_huffman(&a->z_distance,local_9c8 + iVar2,uVar1 + 1);
        if (iVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = 1;
        }
      }
    }
    else {
      a_local._4_4_ = stbi__err("Corrupt PNG");
    }
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__compute_huffman_codes(stbi__zbuf *a)
{
   static const stbi_uc length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
   stbi__zhuffman z_codelength;
   stbi_uc lencodes[286+32+137];//padding for maximum single op
   stbi_uc codelength_sizes[19];
   int i,n;

   int hlit  = stbi__zreceive(a,5) + 257;
   int hdist = stbi__zreceive(a,5) + 1;
   int hclen = stbi__zreceive(a,4) + 4;
   int ntot  = hlit + hdist;

   memset(codelength_sizes, 0, sizeof(codelength_sizes));
   for (i=0; i < hclen; ++i) {
      int s = stbi__zreceive(a,3);
      codelength_sizes[length_dezigzag[i]] = (stbi_uc) s;
   }
   if (!stbi__zbuild_huffman(&z_codelength, codelength_sizes, 19)) return 0;

   n = 0;
   while (n < ntot) {
      int c = stbi__zhuffman_decode(a, &z_codelength);
      if (c < 0 || c >= 19) return stbi__err("bad codelengths", "Corrupt PNG");
      if (c < 16)
         lencodes[n++] = (stbi_uc) c;
      else {
         stbi_uc fill = 0;
         if (c == 16) {
            c = stbi__zreceive(a,2)+3;
            if (n == 0) return stbi__err("bad codelengths", "Corrupt PNG");
            fill = lencodes[n-1];
         } else if (c == 17) {
            c = stbi__zreceive(a,3)+3;
         } else if (c == 18) {
            c = stbi__zreceive(a,7)+11;
         } else {
            return stbi__err("bad codelengths", "Corrupt PNG");
         }
         if (ntot - n < c) return stbi__err("bad codelengths", "Corrupt PNG");
         memset(lencodes+n, fill, c);
         n += c;
      }
   }
   if (n != ntot) return stbi__err("bad codelengths","Corrupt PNG");
   if (!stbi__zbuild_huffman(&a->z_length, lencodes, hlit)) return 0;
   if (!stbi__zbuild_huffman(&a->z_distance, lencodes+hlit, hdist)) return 0;
   return 1;
}